

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O3

int __thiscall
CVmObjFrameDesc::getp_get_vars(CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint *puVar1;
  CVmObjPageEntry *pCVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  CVmObjLookupTable *this_00;
  uint uVar11;
  long lVar12;
  uint uVar13;
  CVmDbgFrameSymPtr sym;
  vm_val_t key;
  vm_val_t val;
  CVmDbgFrameSymPtr local_58;
  vm_val_t local_50;
  vm_val_t local_40;
  
  if (getp_get_vars(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_vars();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_vars::desc);
  if (iVar6 == 0) {
    vVar7 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pvVar5 = sp_;
    puVar1 = (uint *)(this->super_CVmObject).ext_;
    uVar11 = *puVar1;
    pCVar2 = G_obj_table_X.pages_[uVar11 >> 0xc];
    uVar11 = uVar11 & 0xfff;
    lVar12 = *(long *)(*(long *)((long)&pCVar2[uVar11].ptr_ + 8) + 0x18);
    if ((lVar12 != 0) && ((ulong)*(ushort *)(lVar12 + 8) != 0)) {
      this_00 = (CVmObjLookupTable *)
                ((long)&G_obj_table_X.pages_[vVar7 >> 0xc]->ptr_ + (ulong)((vVar7 & 0xfff) * 0x18));
      lVar12 = lVar12 + (ulong)*(ushort *)(lVar12 + 8);
      lVar8 = (long)(int)puVar1[1];
      lVar10 = *(ushort *)(G_dbg_hdr_size_X + lVar12) * G_line_entry_size_X +
               lVar12 + G_dbg_hdr_size_X;
      lVar8 = lVar10 + lVar8 * 2 + (ulong)*(ushort *)(lVar10 + 4 + lVar8 * 2);
      uVar4 = *(undefined4 *)&retval->field_0x4;
      aVar3 = retval->val;
      sp_ = sp_ + 1;
      pvVar5->typ = retval->typ;
      *(undefined4 *)&pvVar5->field_0x4 = uVar4;
      pvVar5->val = aVar3;
      while( true ) {
        local_58.p_ = (uchar *)((long)G_dbg_frame_size_X + lVar8 + 4);
        uVar13 = (uint)*(ushort *)(lVar8 + 6);
        if (*(ushort *)(lVar8 + 6) != 0) {
          do {
            CVmDbgFrameSymPtr::get_str_val(&local_58,&local_50);
            pvVar5 = sp_;
            sp_ = sp_ + 1;
            pvVar5->typ = local_50.typ;
            *(undefined4 *)&pvVar5->field_0x4 = local_50._4_4_;
            pvVar5->val = local_50.val;
            iVar6 = CVmObjLookupTable::index_check(this_00,&local_40,&local_50);
            if (iVar6 == 0) {
              CVmObjFrameRef::get_local_val((CVmObjFrameRef *)(pCVar2 + uVar11),&local_40,&local_58)
              ;
              CVmObjLookupTable::add_entry(this_00,&local_50,&local_40);
            }
            sp_ = sp_ + -1;
            CVmDbgFrameSymPtr::inc(&local_58);
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        uVar9 = (ulong)*(ushort *)(lVar8 + 4);
        if (uVar9 == 0) break;
        lVar8 = *(ushort *)(lVar12 + G_dbg_hdr_size_X) * G_line_entry_size_X +
                lVar12 + G_dbg_hdr_size_X;
        lVar8 = lVar8 + uVar9 * 2 + (ulong)*(ushort *)(lVar8 + 4 + uVar9 * 2);
      }
      sp_ = sp_ + -1;
    }
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_vars(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                   uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* create our lookup table object */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    CVmObjLookupTable *tab = (CVmObjLookupTable *)
                             vm_objp(vmg_ retval->val.obj);

    /* get our extension */
    vm_framedesc_ext *ext = get_ext();

    /* get our underlying frame ref and its extension */
    CVmObjFrameRef *fr = get_frame_ref(vmg0_);
    vm_frameref_ext *fext = fr->get_ext();

    /* set up pointer to this method's debug records */
    CVmDbgTablePtr dp;
    if (!dp.set(fext->entryp))
        return TRUE;

    /* set up a pointer to our frame */
    CVmDbgFramePtr dfp;
    dp.set_frame_ptr(vmg_ &dfp, ext->frame_idx);

    /* push the table for gc protection */
    G_stk->push(retval);

    /* walk up the list of frames from innermost to outermost */
    for (;;)
    {
        /* set up a pointer to the first symbol */
        CVmDbgFrameSymPtr sym;
        dfp.set_first_sym_ptr(vmg_ &sym);

        /* scan this frame's local symbol list */
        int sym_cnt = dfp.get_sym_count();
        for (int i = 0 ; i < sym_cnt ; ++i, sym.inc(vmg0_))
        {
            /* set up a string value for the key */
            vm_val_t key;
            sym.get_str_val(vmg_ &key);
            G_stk->push(&key);

            /* 
             *   If this entry isn't already in the table, add it.  Don't
             *   bother if it already exists: we work from inner to outer
             *   scopes, and inner scopes hide things in outer scopes, so if
             *   we find an entry in the table already it means that it was
             *   an inner-scope entry that hides the one we're processing
             *   now.  
             */
            vm_val_t val;
            if (!tab->index_check(vmg_ &val, &key))
            {
                /* get the value */
                fr->get_local_val(vmg_ &val, &sym);
                
                /* add the entry to the table */
                tab->add_entry(vmg_ &key, &val);
            }

            /* done with the key for gc protection */
            G_stk->discard();
        }

        /* move up to the enclosing frame */
        int parent = dfp.get_enclosing_frame();
        if (parent == 0)
            break;

        /* set up dfp to point to the parent fraem */
        dp.set_frame_ptr(vmg_ &dfp, parent);
    }

    /* discard the table ref we pushed for gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}